

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Scope * equiv_D_Scope(D_Scope *current)

{
  D_Sym *local_30;
  D_Sym *sy;
  D_Scope *last;
  D_Scope *s;
  D_Scope *current_local;
  
  sy = (D_Sym *)current;
  last = current;
  current_local = current;
  if (current != (D_Scope *)0x0) {
    for (; current->depth <= last->depth; last = last->up_updates) {
      if (last->depth == *(uint *)((long)&sy->name + 4)) {
        if (current->up != last->up) break;
        sy = (D_Sym *)last;
      }
      if (((last->ll != (D_Sym *)0x0) || (last->hash != (D_SymHash *)0x0)) ||
         (last->dynamic != (D_Scope *)0x0)) break;
      local_30 = last->updates;
      while ((local_30 != (D_Sym *)0x0 && (current->depth < local_30->scope->depth))) {
        local_30 = local_30->next;
      }
      if ((local_30 != (D_Sym *)0x0) || (last->up_updates == (D_Scope *)0x0)) break;
    }
    current_local = (D_Scope *)sy;
  }
  return current_local;
}

Assistant:

D_Scope *equiv_D_Scope(D_Scope *current) {
  D_Scope *s = current, *last = current;
  D_Sym *sy;
  if (!s) return s;
  while (s->depth >= current->depth) {
    if (s->depth == last->depth) {
      if (current->up == s->up)
        last = s;
      else
        break;
    }
    if (s->ll || s->hash) break;
    if (s->dynamic) break;
    sy = s->updates;
    while (sy) {
      if (sy->scope->depth <= current->depth) break;
      sy = sy->next;
    }
    if (sy) break;
    if (!s->up_updates) break;
    s = s->up_updates;
  }
  return last;
}